

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadHalfArray
          (CrateReader *this,bool is_compressed,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *d)

{
  StreamReader *pSVar1;
  bool bVar2;
  half hVar3;
  ostream *poVar4;
  long lVar5;
  void *pvVar6;
  half *phVar7;
  ssize_t sVar8;
  int *out;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  uint *out_00;
  reference puVar12;
  iterator iStack_788;
  uint index;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  half *o;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> lut;
  uint32_t lutSize;
  half h;
  size_type sStack_728;
  float f;
  size_t i;
  undefined1 local_718 [8];
  vector<int,_std::allocator<int>_> ints;
  char code;
  size_t sz;
  ostringstream local_6d0 [8];
  ostringstream ss_e_3;
  string local_558;
  allocator local_531;
  string local_530;
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream ss_e_2;
  ulong local_378;
  uint64_t n_1;
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  uint local_1d4;
  undefined1 local_1d0 [4];
  uint32_t n;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  uint32_t local_34;
  ulong uStack_30;
  uint32_t shapesize;
  size_t length;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *d_local;
  CrateReader *pCStack_18;
  bool is_compressed_local;
  CrateReader *this_local;
  
  length = (size_t)d;
  d_local._7_1_ = is_compressed;
  pCStack_18 = this;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,&local_34);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar4 = ::std::operator<<((ostream *)local_1b0,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadHalfArray");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1a7);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_1b0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_1d0);
      ::std::__cxx11::string::~string((string *)local_1d0);
      ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
      this_local._7_1_ = 0;
      goto LAB_00213928;
    }
    bVar2 = StreamReader::read4(this->_sr,&local_1d4);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_350);
      poVar4 = ::std::operator<<((ostream *)local_350,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,"[Crate]");
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadHalfArray");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1ac);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_350,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&n_1);
      ::std::__cxx11::string::~string((string *)&n_1);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_350);
      goto LAB_00213928;
    }
    uStack_30 = (ulong)local_1d4;
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,&local_378);
    if (!bVar2) {
      ::std::__cxx11::string::operator+=
                ((string *)&this->_err,"Failed to read the number of array elements.\n");
      this_local._7_1_ = 0;
      goto LAB_00213928;
    }
    uStack_30 = local_378;
  }
  if ((this->_config).maxArrayElements < uStack_30) {
    ::std::__cxx11::ostringstream::ostringstream(local_4f0);
    poVar4 = ::std::operator<<((ostream *)local_4f0,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadHalfArray");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1ba);
    ::std::operator<<(poVar4," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_530,"Too many array elements {}.",&local_531);
    fmt::format<unsigned_long>(&local_510,&local_530,&stack0xffffffffffffffd0);
    poVar4 = ::std::operator<<((ostream *)local_4f0,(string *)&local_510);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::~string((string *)&local_510);
    ::std::__cxx11::string::~string((string *)&local_530);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_558);
    ::std::__cxx11::string::~string((string *)&local_558);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
  }
  else {
    this->_memoryUsage = uStack_30 * 2 + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_6d0);
      poVar4 = ::std::operator<<((ostream *)local_6d0,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,"[Crate]");
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadHalfArray");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1bd);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_6d0,"Reached to max memory budget.");
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&sz);
      ::std::__cxx11::string::~string((string *)&sz);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_6d0);
    }
    else {
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)length,
                 uStack_30);
      if ((d_local._7_1_ & 1) == 0) {
        pSVar1 = this->_sr;
        lVar5 = uStack_30 << 1;
        pvVar6 = (void *)(uStack_30 << 1);
        phVar7 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::data
                           ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )length);
        sVar8 = StreamReader::read(pSVar1,(int)lVar5,pvVar6,(size_t)phVar7);
        if (sVar8 == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read half array data.\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else if (uStack_30 < 0x10) {
        pvVar6 = (void *)(uStack_30 << 1);
        pSVar1 = this->_sr;
        phVar7 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::data
                           ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )length);
        sVar8 = StreamReader::read(pSVar1,(int)pvVar6,pvVar6,(size_t)phVar7);
        if (sVar8 == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read uncompressed array data.\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        bVar2 = StreamReader::read1(this->_sr,
                                    (char *)((long)&ints.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 7));
        if (bVar2) {
          if (ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._7_1_ == 'i') {
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_718);
            ::std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)local_718,uStack_30);
            out = ::std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)local_718);
            sVar9 = ::std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_718);
            bVar2 = ReadCompressedInts<int>(this,out,sVar9);
            if (bVar2) {
              for (sStack_728 = 0; sStack_728 < uStack_30; sStack_728 = sStack_728 + 1) {
                pvVar10 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_718,sStack_728);
                hVar3 = tinyusdz::value::float_to_half_full((float)*pvVar10);
                pvVar11 = ::std::
                          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                          operator[]((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                      *)length,sStack_728);
                pvVar11->value = hVar3.value;
              }
              bVar2 = false;
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read compressed ints in ReadHalfArray.\n")
              ;
              this_local._7_1_ = 0;
              bVar2 = true;
            }
            ::std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_718);
            if (bVar2) goto LAB_00213928;
          }
          else {
            if (ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._7_1_ != 't') {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Invalid code. Data is currupted\n");
              this_local._7_1_ = 0;
              goto LAB_00213928;
            }
            bVar2 = StreamReader::read4(this->_sr,
                                        (uint32_t *)
                                        ((long)&lut.
                                                super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4));
            if (!bVar2) {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read lutSize in ReadHalfArray.\n");
              this_local._7_1_ = 0;
              goto LAB_00213928;
            }
            ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ulong)lut.
                              super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            pSVar1 = this->_sr;
            phVar7 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                     data((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                          &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
            sVar8 = StreamReader::read(pSVar1,lut.
                                              super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_ << 1,
                                       (void *)((ulong)lut.
                                                  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_ << 1),(size_t)phVar7);
            if (sVar8 == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read lut table in ReadHalfArray.\n");
              this_local._7_1_ = 0;
              bVar2 = true;
            }
            else {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o,uStack_30);
              out_00 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              sVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              bVar2 = ReadCompressedInts<unsigned_int>(this,out_00,sVar9);
              if (bVar2) {
                __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ::std::
                           vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                           data((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                 *)length);
                __end5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
                iStack_788 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
                while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffff878), bVar2) {
                  puVar12 = __gnu_cxx::
                            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            ::operator*(&__end5);
                  pvVar11 = ::std::
                            vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                            operator[]((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                        *)&indexes.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)*puVar12);
                  *(uint16_t *)
                   &(__range5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start = pvVar11->value;
                  __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator++(&__end5);
                  __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)&(__range5->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 2);
                }
                bVar2 = false;
              }
              else {
                ::std::__cxx11::string::operator+=
                          ((string *)&this->_err,"Failed to read lut indices in ReadHalfArray.\n");
                this_local._7_1_ = 0;
                bVar2 = true;
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
            }
            ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar2) goto LAB_00213928;
          }
          this_local._7_1_ = 1;
        }
        else {
          ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read the code.\n");
          this_local._7_1_ = 0;
        }
      }
    }
  }
LAB_00213928:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadHalfArray(bool is_compressed,
                                std::vector<value::half> *d) {
  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many array elements {}.", length));
  }

  CHECK_MEMORY_USAGE(length * sizeof(uint16_t));

  d->resize(length);

  if (!is_compressed) {


    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(uint16_t) * length, sizeof(uint16_t) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read half array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(uint16_t) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadHalfArray.\n";
        return false;
      }
      for (size_t i = 0; i < length; i++) {
        float f = float(ints[i]);
        value::half h = value::float_to_half_full(f);
        (*d)[i] = h;
      }
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadHalfArray.\n";
        return false;
      }

      std::vector<value::half> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(value::half) * lutSize, sizeof(value::half) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadHalfArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadHalfArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}